

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

UniValue * GetNetworksInfo(void)

{
  bool bVar1;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  Network network;
  int n;
  UniValue *networks;
  UniValue obj;
  Proxy proxy;
  UniValue *in_stack_fffffffffffffb78;
  UniValue *in_stack_fffffffffffffb80;
  UniValue *in_stack_fffffffffffffb88;
  UniValue *in_stack_fffffffffffffb90;
  Network in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  ReachableNets *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  Network in_stack_fffffffffffffbbc;
  UniValue *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  int local_408;
  undefined1 local_3e7 [2];
  undefined1 local_3e5;
  undefined1 local_3e4 [2];
  undefined1 local_3e2;
  undefined1 local_3e1 [985];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb90);
  UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (VType)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                     (string *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb78);
  for (local_408 = 0; local_408 < 7; local_408 = local_408 + 1) {
    if ((local_408 != 0) && (local_408 != 6)) {
      Proxy::Proxy((Proxy *)in_stack_fffffffffffffb78);
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb90);
      UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (VType)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                         (string *)in_stack_fffffffffffffb88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      GetProxy(in_stack_fffffffffffffb98,(Proxy *)in_stack_fffffffffffffb90);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffffbc0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      GetNetworkName_abi_cxx11_((Network)((ulong)in_RDI >> 0x20));
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbb0);
      UniValue::pushKV(in_stack_fffffffffffffbc0,
                       (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (UniValue *)in_stack_fffffffffffffbb0);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)local_3e1);
      in_stack_fffffffffffffbc0 = (UniValue *)&local_3e2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffffbc0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      bVar1 = ReachableNets::Contains(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbbc);
      in_stack_fffffffffffffbbc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbbc);
      local_3e4[1] = ~bVar1 & 1;
      UniValue::UniValue<bool,_bool,_true>
                ((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (bool *)in_stack_fffffffffffffbb0);
      UniValue::pushKV(in_stack_fffffffffffffbc0,
                       (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (UniValue *)in_stack_fffffffffffffbb0);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e2);
      in_stack_fffffffffffffbb0 = (ReachableNets *)local_3e4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffffbc0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      local_3e5 = ReachableNets::Contains(in_stack_fffffffffffffbb0,in_stack_fffffffffffffbbc);
      UniValue::UniValue<bool,_bool,_true>
                ((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (bool *)in_stack_fffffffffffffbb0);
      UniValue::pushKV(in_stack_fffffffffffffbc0,
                       (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (UniValue *)in_stack_fffffffffffffbb0);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)local_3e4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffffbc0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      bVar1 = Proxy::IsValid((Proxy *)in_stack_fffffffffffffb80);
      in_stack_fffffffffffffb9c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb9c);
      if (bVar1) {
        Proxy::ToString_abi_cxx11_((Proxy *)in_stack_fffffffffffffb90);
      }
      else {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb90);
      }
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffbb0);
      UniValue::pushKV(in_stack_fffffffffffffbc0,
                       (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (UniValue *)in_stack_fffffffffffffbb0);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)(local_3e7 + 1));
      in_stack_fffffffffffffb90 = (UniValue *)local_3e7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,(char *)in_stack_fffffffffffffbc0,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8));
      UniValue::UniValue<bool_&,_bool,_true>
                ((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 (bool *)in_stack_fffffffffffffbb0);
      UniValue::pushKV(in_stack_fffffffffffffbc0,
                       (string *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (UniValue *)in_stack_fffffffffffffbb0);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb78);
      std::allocator<char>::~allocator((allocator<char> *)local_3e7);
      in_stack_fffffffffffffb88 = (UniValue *)(local_3e1 + 1);
      UniValue::UniValue(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      UniValue::push_back(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      UniValue::~UniValue(in_stack_fffffffffffffb78);
      Proxy::~Proxy((Proxy *)in_stack_fffffffffffffb78);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue GetNetworksInfo()
{
    UniValue networks(UniValue::VARR);
    for (int n = 0; n < NET_MAX; ++n) {
        enum Network network = static_cast<enum Network>(n);
        if (network == NET_UNROUTABLE || network == NET_INTERNAL) continue;
        Proxy proxy;
        UniValue obj(UniValue::VOBJ);
        GetProxy(network, proxy);
        obj.pushKV("name", GetNetworkName(network));
        obj.pushKV("limited", !g_reachable_nets.Contains(network));
        obj.pushKV("reachable", g_reachable_nets.Contains(network));
        obj.pushKV("proxy", proxy.IsValid() ? proxy.ToString() : std::string());
        obj.pushKV("proxy_randomize_credentials", proxy.m_randomize_credentials);
        networks.push_back(std::move(obj));
    }
    return networks;
}